

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<int,int,int(*)(char_const**,int*)>
               (int num1,_func_int_char_ptr_ptr_int_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined1 *puVar7;
  char (*pacVar8) [16];
  byte *pbVar9;
  byte bVar10;
  char (*pacVar11) [16];
  undefined1 *puVar12;
  code *pcVar13;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  float fVar14;
  uint extraout_EDX_01;
  char *pcVar15;
  ulong uVar16;
  double dVar17;
  uint uVar18;
  ulong uVar19;
  byte *pbVar20;
  char *pcVar21;
  undefined8 *puVar22;
  undefined1 *puVar23;
  byte *pbVar24;
  char *pcVar25;
  char *pcVar26;
  byte *pbVar27;
  uint *puVar28;
  char (*pacVar29) [16];
  char cVar30;
  byte *pbVar31;
  char *pcVar32;
  undefined8 uVar33;
  ulong uVar34;
  byte *pbVar35;
  char *pcVar36;
  undefined8 *puVar37;
  long lVar38;
  char *pcVar39;
  undefined *puVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_1538;
  undefined1 *puStack_1530;
  char acStack_1528 [256];
  undefined1 uStack_1428;
  undefined8 uStack_1427;
  undefined1 auStack_141f [255];
  char (*pacStack_1320) [16];
  undefined8 uStack_1318;
  undefined *puStack_1310;
  code *pcStack_1308;
  double dStack_1300;
  byte *pbStack_12f8;
  char acStack_12f0 [256];
  byte abStack_11f0 [16];
  byte abStack_11e0 [248];
  long lStack_10e8;
  ulong uStack_10e0;
  char *pcStack_10d8;
  char *pcStack_10d0;
  char *pcStack_10c8;
  code *pcStack_10c0;
  char (*pacStack_10b8) [16];
  char *pcStack_10b0;
  float fStack_10a8;
  undefined4 uStack_10a4;
  double dStack_10a0;
  double dStack_1098;
  char (*pacStack_1090) [16];
  char acStack_1088 [256];
  byte bStack_f88;
  undefined8 uStack_f87;
  char acStack_f7f [255];
  long lStack_e80;
  ulong uStack_e78;
  char *pcStack_e70;
  char *pcStack_e68;
  char *pcStack_e60;
  code *pcStack_e58;
  char (*pacStack_e50) [16];
  char *pcStack_e48;
  float fStack_e40;
  undefined4 uStack_e3c;
  double dStack_e38;
  double dStack_e30;
  code *pcStack_e28;
  byte bStack_e20;
  undefined8 uStack_e1f;
  char acStack_e17 [247];
  char acStack_d20 [256];
  undefined1 auStack_c20 [8];
  undefined8 *puStack_c18;
  ulong uStack_c10;
  undefined8 *puStack_c08;
  long lStack_c00;
  undefined1 *puStack_bf8;
  code *pcStack_bf0;
  code *pcStack_be8;
  float fStack_bdc;
  double dStack_bd8;
  double dStack_bd0;
  undefined8 *puStack_bc8;
  char (*pacStack_bc0) [16];
  byte bStack_bb8;
  undefined1 auStack_bb7 [2];
  undefined1 auStack_bb5 [6];
  undefined8 auStack_baf [30];
  char acStack_ab8 [256];
  undefined1 auStack_9b8 [8];
  char (*pacStack_9b0) [16];
  char *pcStack_9a8;
  char *pcStack_9a0;
  char (*pacStack_998) [16];
  long lStack_990;
  code *pcStack_988;
  float fStack_974;
  char (*pacStack_970) [16];
  int iStack_964;
  double dStack_960;
  double dStack_958;
  byte bStack_950;
  undefined8 uStack_94f;
  char acStack_947 [247];
  char acStack_850 [256];
  undefined1 auStack_750 [8];
  ulong uStack_748;
  char *pcStack_740;
  long lStack_738;
  undefined1 *puStack_730;
  undefined1 *puStack_728;
  code *pcStack_720;
  uint uStack_70c;
  ulong uStack_708;
  float fStack_6fc;
  ulong uStack_6f8;
  double dStack_6f0;
  byte bStack_6e8;
  undefined8 uStack_6e7;
  undefined1 auStack_6df [247];
  char acStack_5e8 [256];
  char acStack_4e8 [8];
  byte *pbStack_4e0;
  byte *pbStack_4d8;
  byte *pbStack_4d0;
  char (*pacStack_4c8) [16];
  ulong uStack_4c0;
  code *pcStack_4b8;
  char (*pacStack_4b0) [16];
  float fStack_4a8;
  int iStack_4a4;
  ulong uStack_4a0;
  double dStack_498;
  byte bStack_490;
  undefined8 uStack_48f;
  byte abStack_487 [247];
  char acStack_390 [256];
  undefined1 auStack_290 [8];
  ulong uStack_288;
  char *pcStack_280;
  undefined1 *puStack_278;
  long lStack_270;
  undefined1 *puStack_268;
  code *pcStack_260;
  int local_258;
  float local_254;
  ulong local_250;
  ulong local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  undefined1 local_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(local_138,"typed read of ",0xf);
  uVar34 = (ulong)num1;
  if (num1 < 0) {
    pcVar15 = "%lld";
    uVar16 = uVar34;
  }
  else {
    pcVar15 = "%llu";
    uVar16 = (ulong)(uint)num1;
  }
  pcStack_260 = (code *)0x137249;
  local_258 = num1;
  iVar3 = snprintf(local_138 + 0xe,0xf2,pcVar15,uVar16);
  pcVar15 = local_138 + 0xe + iVar3;
  iVar4 = 0;
  pcStack_260 = (code *)0x137267;
  iVar3 = snprintf(pcVar15,(size_t)(local_38 + -(long)pcVar15)," into ");
  pcStack_260 = (code *)0x137286;
  snprintf(pcVar15 + iVar3,(size_t)(local_38 + -(long)(pcVar15 + iVar3)),"int%zu_t",0x20);
  pcStack_260 = (code *)0x137295;
  _space((FILE *)_stdout);
  pcStack_260 = (code *)0x1372ae;
  fwrite("# ",2,1,_stdout);
  pcStack_260 = (code *)0x1372be;
  fputs(local_138,_stdout);
  pcStack_260 = (code *)0x1372cb;
  fputc(10,_stdout);
  iVar3 = local_258;
  if (-1 < local_258) {
    pcStack_260 = (code *)0x1372e1;
    iVar4 = test_encode_uint_all_sizes((char (*) [16])&local_238,(ulong)(uint)num1);
  }
  pacVar11 = (char (*) [16])(&local_238 + (long)iVar4 * 0x10);
  pcStack_260 = (code *)0x137302;
  local_250 = uVar34;
  iVar5 = test_encode_int_all_sizes(pacVar11,uVar34);
  uVar18 = iVar4 + iVar5;
  if (uVar18 != 0 && SCARRY4(iVar4,iVar5) == (int)uVar18 < 0) {
    local_254 = (float)iVar3;
    local_240 = (double)iVar3;
    local_248 = (ulong)uVar18;
    puVar23 = (undefined1 *)((long)&local_237 + 1);
    lVar38 = 0;
    uVar34 = (ulong)uVar18;
    do {
      lVar6 = lVar38 * 0x10;
      bVar10 = puVar23[-2];
      uVar16 = (ulong)bVar10;
      uVar19 = (ulong)(uint)(int)(char)bVar10;
      mVar1 = mp_type_hint[uVar16];
      puVar12 = puVar23;
      if (mVar1 != MP_UINT) {
        if (mVar1 == MP_FLOAT) {
          if (bVar10 != 0xca) goto LAB_00137660;
          uVar18 = *(uint *)(puVar23 + -1);
          fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                          uVar18 << 0x18);
          if ((fVar14 != local_254) || (NAN(fVar14) || NAN(local_254))) {
            pcStack_260 = (code *)0x137684;
            test_read_num<int,int,int(*)(char_const**,int*)>();
            goto LAB_00137684;
          }
          puVar12 = puVar23 + 3;
          goto LAB_0013742e;
        }
        if (mVar1 == MP_INT) {
          uVar16 = (ulong)(char)bVar10;
          iVar3 = bVar10 - 0xd0;
          puVar28 = &switchD_00137390::switchdataD_00140cfc;
          switch(iVar3) {
          case 0:
            uVar16 = (ulong)(char)puVar23[-1];
            break;
          case 1:
            uVar16 = (ulong)(short)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8)
            ;
            puVar12 = local_22f + lVar6 + -6;
            break;
          case 2:
            uVar18 = *(uint *)(puVar23 + -1);
            uVar16 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8
                                 | uVar18 << 0x18);
            puVar12 = local_22f + lVar6 + -4;
            break;
          case 3:
            uVar16 = *(ulong *)(puVar23 + -1);
            uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                     (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                     (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                     (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
            puVar12 = local_22f + lVar6;
            break;
          default:
            if (bVar10 < 0xe0) {
              pcStack_260 = (code *)0x13764c;
              test_read_num<int,int,int(*)(char_const**,int*)>();
              goto LAB_0013764c;
            }
            puVar28 = (uint *)pacVar11;
            puVar12 = local_22f + lVar6 + -8;
          }
          if (uVar16 != local_250) {
            pcStack_260 = (code *)0x1376a8;
            test_read_num<int,int,int(*)(char_const**,int*)>();
            goto LAB_001376a8;
          }
          goto LAB_001374bc;
        }
        if (bVar10 != 0xcb) {
LAB_00137684:
          pcStack_260 = (code *)0x1376a3;
          __assert_fail("c == 0xcb",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x987,"double mp_decode_double(const char **)");
        }
        uVar34 = *(ulong *)(puVar23 + -1);
        dVar17 = (double)(uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                          (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                          (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                          (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38);
        if ((dVar17 == local_240) && (!NAN(dVar17) && !NAN(local_240))) {
          puVar12 = local_22f + lVar6;
          goto LAB_0013742e;
        }
        goto LAB_0013765b;
      }
      iVar3 = bVar10 - 0xcc;
      puVar28 = &switchD_001373ed::switchdataD_00140cec;
      switch(iVar3) {
      case 0:
        uVar16 = (ulong)(byte)puVar23[-1];
        break;
      case 1:
        uVar16 = (ulong)(ushort)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8);
        puVar12 = local_22f + lVar6 + -6;
        break;
      case 2:
        uVar18 = *(uint *)(puVar23 + -1);
        uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        puVar12 = local_22f + lVar6 + -4;
        break;
      case 3:
        uVar16 = *(ulong *)(puVar23 + -1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        puVar12 = local_22f + lVar6;
        break;
      default:
        if (-1 < (char)bVar10) {
          puVar28 = (uint *)pacVar11;
          puVar12 = local_22f + lVar6 + -8;
          break;
        }
LAB_0013764c:
        pcStack_260 = (code *)0x137651;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_00137651;
      }
      if (uVar16 != local_250) {
LAB_001376a8:
        pcStack_260 = test_read_num<int,long,int(*)(char_const**,int*)>;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_390,"typed read of ",0xf);
        pcVar26 = "%lld";
        if (-1 < (long)puVar28) {
          pcVar26 = "%llu";
        }
        iVar4 = 0;
        pcStack_4b8 = (code *)0x13771d;
        iStack_4a4 = iVar3;
        uStack_288 = uVar34;
        pcStack_280 = pcVar15;
        puStack_278 = puVar23 + -2;
        lStack_270 = lVar38;
        puStack_268 = puVar12;
        pcStack_260 = (code *)puVar23;
        iVar3 = snprintf(acStack_390 + 0xe,0xf2,pcVar26,puVar28);
        pbVar9 = (byte *)(acStack_390 + (long)iVar3 + 0xe);
        pcStack_4b8 = (code *)0x137741;
        iVar3 = snprintf((char *)pbVar9,(size_t)(auStack_290 + -(long)pbVar9)," into ");
        pcStack_4b8 = (code *)0x137760;
        snprintf((char *)(pbVar9 + iVar3),(size_t)(auStack_290 + -(long)(pbVar9 + iVar3)),"int%zu_t"
                 ,0x20);
        pcStack_4b8 = (code *)0x13776f;
        _space((FILE *)_stdout);
        pcStack_4b8 = (code *)0x137788;
        fwrite("# ",2,1,_stdout);
        pcStack_4b8 = (code *)0x137798;
        fputs(acStack_390,_stdout);
        pcStack_4b8 = (code *)0x1377a5;
        fputc(10,_stdout);
        pacStack_4b0 = (char (*) [16])puVar28;
        if (-1 < (long)puVar28) {
          pcStack_4b8 = (code *)0x1377bb;
          iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_490,(uint64_t)puVar28);
        }
        pacVar11 = (char (*) [16])(&bStack_490 + (long)iVar4 * 0x10);
        pcStack_4b8 = (code *)0x1377d8;
        iVar3 = test_encode_int_all_sizes(pacVar11,(int64_t)pacStack_4b0);
        uVar18 = iVar4 + iVar3;
        if (uVar18 == 0 || SCARRY4(iVar4,iVar3) != (int)uVar18 < 0) {
          return;
        }
        fStack_4a8 = (float)(long)pacStack_4b0;
        dStack_498 = (double)(long)pacStack_4b0;
        pbVar35 = (byte *)(ulong)uVar18;
        pbVar24 = (byte *)((long)&uStack_48f + 1);
        uVar34 = 0;
        goto LAB_00137808;
      }
LAB_001374bc:
      switch(bVar10) {
      case 0xcc:
        uVar19 = (ulong)(byte)puVar23[-1];
        goto LAB_001374e9;
      case 0xcd:
        puVar7 = local_22f + lVar6 + -6;
        uVar19 = (ulong)(ushort)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8);
        break;
      case 0xce:
        uVar18 = *(uint *)(puVar23 + -1);
        uVar19 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        puVar7 = puVar23 + 3;
        goto LAB_00137505;
      case 0xcf:
        uVar34 = *(ulong *)(puVar23 + -1);
        uVar19 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                 (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                 (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                 (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38;
        puVar7 = local_22f + lVar6;
LAB_00137505:
        if (uVar19 < 0x80000000) break;
LAB_0013742e:
        uVar19 = 0;
        iVar3 = 0;
        puVar7 = puVar23 + -2;
        goto LAB_0013755f;
      case 0xd0:
        uVar19 = (ulong)(uint)(int)(char)puVar23[-1];
LAB_001374e9:
        puVar7 = local_22f + lVar6 + -7;
        break;
      case 0xd1:
        puVar7 = local_22f + lVar6 + -6;
        uVar19 = (ulong)(uint)(int)(short)(*(ushort *)(puVar23 + -1) << 8 |
                                          *(ushort *)(puVar23 + -1) >> 8);
        break;
      case 0xd2:
        uVar18 = *(uint *)(puVar23 + -1);
        uVar19 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        puVar7 = local_22f + lVar6 + -4;
        break;
      case 0xd3:
        uVar34 = *(ulong *)(puVar23 + -1);
        uVar16 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                 (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8;
        uVar19 = uVar16 | (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                 (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38;
        if ((long)(int)uVar16 == uVar19) {
          puVar7 = local_22f + lVar6;
          break;
        }
        goto LAB_0013742e;
      default:
        if ((char)bVar10 < -0x20) goto LAB_0013742e;
        iVar3 = 1;
        puVar7 = local_22f + lVar6 + -8;
        goto LAB_0013755f;
      }
      iVar3 = 1;
LAB_0013755f:
      pcVar15 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      pcStack_260 = (code *)0x137583;
      _ok(iVar3,"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X");
      pcStack_260 = (code *)0x1375a9;
      _ok((uint)(puVar12 == puVar7),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      iVar3 = (int)uVar19;
      if (local_258 < 0) {
        if (-1 < iVar3) goto LAB_00137656;
        pcVar26 = "(int64_t)num1 == (int64_t)num2";
        iVar4 = 0x746;
      }
      else {
        if (iVar3 < 0) {
LAB_00137651:
          pcStack_260 = (code *)0x137656;
          test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_00137656:
          pcStack_260 = (code *)0x13765b;
          test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0013765b:
          pcStack_260 = (code *)0x137660;
          test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_00137660:
          pcStack_260 = (code *)0x13767f;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        pcVar26 = "(uint64_t)num1 == (uint64_t)num2";
        iVar4 = 0x743;
      }
      pacVar11 = (char (*) [16])(ulong)(iVar3 == local_258);
      pcStack_260 = (code *)0x137602;
      _ok((uint)(iVar3 == local_258),pcVar26,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar4,"check int number");
      lVar38 = lVar38 + 1;
      puVar23 = puVar23 + 0x10;
      local_248 = local_248 - 1;
      uVar34 = uVar19;
    } while (local_248 != 0);
  }
  return;
LAB_00137808:
  uVar18 = (uint)pacVar11;
  lVar38 = uVar34 * 0x10;
  pbVar20 = &bStack_490 + lVar38;
  pbVar31 = pbVar24 + -2;
  bVar10 = pbVar24[-2];
  pacVar11 = (char (*) [16])(ulong)bVar10;
  uVar16 = (ulong)(uint)(int)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar11];
  pbVar27 = pbVar24;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_00137bd8:
        pcStack_4b8 = (code *)0x137bf7;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar2 = *(uint *)(pbVar24 + -1);
      fVar14 = (float)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18);
      if ((fVar14 == fStack_4a8) && (!NAN(fVar14) && !NAN(fStack_4a8))) {
        pbVar27 = pbVar24 + 3;
        goto LAB_0013790e;
      }
      pcStack_4b8 = (code *)0x137bfc;
      test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bfc:
      pcStack_4b8 = (code *)0x137c01;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00137c01;
    }
    if (mVar1 == MP_INT) {
      pacVar11 = (char (*) [16])(long)(char)bVar10;
      switch(bVar10) {
      case 0xd0:
        pacVar11 = (char (*) [16])(long)(char)pbVar24[-1];
        break;
      case 0xd1:
        pacVar11 = (char (*) [16])
                   (long)(short)(*(ushort *)(pbVar24 + -1) << 8 | *(ushort *)(pbVar24 + -1) >> 8);
        pbVar27 = abStack_487 + lVar38 + -6;
        break;
      case 0xd2:
        uVar2 = *(uint *)(pbVar24 + -1);
        pacVar11 = (char (*) [16])
                   (long)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                              uVar2 << 0x18);
        pbVar27 = abStack_487 + lVar38 + -4;
        break;
      case 0xd3:
        uVar19 = *(ulong *)(pbVar24 + -1);
        pacVar11 = (char (*) [16])
                   (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                    (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                    (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                    (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38);
        pbVar27 = abStack_487 + lVar38;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_4b8 = (code *)0x137baa;
          test_read_num<int,long,int(*)(char_const**,int*)>();
          goto LAB_00137baa;
        }
        pbVar27 = abStack_487 + lVar38 + -8;
      }
      if (pacVar11 != pacStack_4b0) goto LAB_00137bfc;
      goto LAB_0013799d;
    }
    if (bVar10 != 0xcb) goto LAB_00137bb4;
    uVar16 = *(ulong *)(pbVar24 + -1);
    dVar17 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar17 != dStack_498) || (NAN(dVar17) || NAN(dStack_498))) {
      pcStack_4b8 = (code *)0x137bd8;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00137bd8;
    }
    pbVar27 = abStack_487 + lVar38;
    goto LAB_0013790e;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar11 = (char (*) [16])(ulong)pbVar24[-1];
    break;
  case 0xcd:
    pacVar11 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pbVar24 + -1) << 8 | *(ushort *)(pbVar24 + -1) >> 8);
    pbVar27 = abStack_487 + lVar38 + -6;
    break;
  case 0xce:
    uVar2 = *(uint *)(pbVar24 + -1);
    pacVar11 = (char (*) [16])
               (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18);
    pbVar27 = abStack_487 + lVar38 + -4;
    break;
  case 0xcf:
    uVar19 = *(ulong *)(pbVar24 + -1);
    pacVar11 = (char (*) [16])
               (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28
               | uVar19 << 0x38);
    pbVar27 = abStack_487 + lVar38;
    break;
  default:
    if (-1 < (char)bVar10) {
      pbVar27 = abStack_487 + lVar38 + -8;
      break;
    }
LAB_00137baa:
    pcStack_4b8 = (code *)0x137baf;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_00137baf;
  }
  if (pacVar11 != pacStack_4b0) {
LAB_00137c01:
    pcStack_4b8 = (code *)0x137c06;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    pbVar27 = pbVar35;
    pcVar15 = (char *)puVar28;
    goto LAB_00137c06;
  }
LAB_0013799d:
  switch(bVar10) {
  case 0xcc:
    uVar16 = (ulong)pbVar24[-1];
    goto LAB_001379ca;
  case 0xcd:
    pbVar20 = abStack_487 + lVar38 + -6;
    uVar16 = (ulong)(ushort)(*(ushort *)(pbVar24 + -1) << 8 | *(ushort *)(pbVar24 + -1) >> 8);
    break;
  case 0xce:
    uVar18 = *(uint *)(pbVar24 + -1);
    uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    pbVar20 = pbVar24 + 3;
    goto LAB_001379e6;
  case 0xcf:
    uVar16 = *(ulong *)(pbVar24 + -1);
    uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
             (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 | (uVar16 & 0xff00) << 0x28 |
             uVar16 << 0x38;
    pbVar20 = abStack_487 + lVar38;
LAB_001379e6:
    if (uVar16 < 0x80000000) break;
LAB_0013790e:
    uVar16 = 0;
    iVar4 = 1;
    iVar3 = 0;
    pbVar20 = pbVar31;
    goto LAB_00137a3f;
  case 0xd0:
    uVar16 = (ulong)(uint)(int)(char)pbVar24[-1];
LAB_001379ca:
    pbVar20 = abStack_487 + lVar38 + -7;
    break;
  case 0xd1:
    pbVar20 = abStack_487 + lVar38 + -6;
    uVar16 = (ulong)(uint)(int)(short)(*(ushort *)(pbVar24 + -1) << 8 |
                                      *(ushort *)(pbVar24 + -1) >> 8);
    break;
  case 0xd2:
    uVar18 = *(uint *)(pbVar24 + -1);
    uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    pbVar20 = abStack_487 + lVar38 + -4;
    break;
  case 0xd3:
    uVar16 = *(ulong *)(pbVar24 + -1);
    uVar19 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
             (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8;
    uVar16 = uVar19 | (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
             (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
    if ((long)(int)uVar19 == uVar16) {
      pbVar20 = abStack_487 + lVar38;
      break;
    }
    goto LAB_0013790e;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013790e;
    iVar3 = 1;
    iVar4 = 0;
    pbVar20 = abStack_487 + lVar38 + -8;
    goto LAB_00137a3f;
  }
  iVar3 = 1;
  iVar4 = 0;
LAB_00137a3f:
  if ((char)iStack_4a4 == '\0') {
    pcStack_4b8 = (code *)0x137b01;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X");
    pacVar11 = (char (*) [16])(ulong)(pbVar31 == pbVar20);
    pcStack_4b8 = (code *)0x137b27;
    _ok((uint)(pbVar31 == pbVar20),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcVar15 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4b8 = (code *)0x137a7e;
    uStack_4a0 = uVar34;
    _ok(iVar3,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X");
    uVar18 = (uint)(pbVar27 == pbVar20);
    pcStack_4b8 = (code *)0x137aa4;
    _ok((uint)(pbVar27 == pbVar20),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    iVar3 = (int)uVar16;
    if ((long)pacStack_4b0 < 0) {
      pbVar9 = pbVar35;
      uVar34 = uVar16;
      if (-1 < iVar3) {
LAB_00137c06:
        pcStack_4b8 = test_read_num<long,int,int(*)(char_const**,long*)>;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_5e8,"typed read of ",0xf);
        uVar16 = (ulong)(int)uVar18;
        if ((int)uVar18 < 0) {
          pcVar26 = "%lld";
          uVar19 = uVar16;
        }
        else {
          pcVar26 = "%llu";
          uVar19 = (ulong)uVar18;
        }
        pcStack_720 = (code *)0x137c8b;
        uStack_70c = uVar18;
        pbStack_4e0 = pbVar20;
        pbStack_4d8 = pbVar9;
        pbStack_4d0 = pbVar27;
        pacStack_4c8 = (char (*) [16])pcVar15;
        uStack_4c0 = uVar34;
        pcStack_4b8 = (code *)pbVar24;
        iVar3 = snprintf(acStack_5e8 + 0xe,0xf2,pcVar26,uVar19);
        pcVar26 = acStack_5e8 + 0xe + iVar3;
        iVar4 = 0;
        pcStack_720 = (code *)0x137ca9;
        iVar3 = snprintf(pcVar26,(size_t)(acStack_4e8 + -(long)pcVar26)," into ");
        pcVar15 = acStack_4e8 + -(long)(pcVar26 + iVar3);
        pcStack_720 = (code *)0x137cc8;
        snprintf(pcVar26 + iVar3,(size_t)pcVar15,"int%zu_t",0x40);
        pcStack_720 = (code *)0x137cd7;
        _space((FILE *)_stdout);
        pcStack_720 = (code *)0x137cf0;
        fwrite("# ",2,1,_stdout);
        pcStack_720 = (code *)0x137d00;
        fputs(acStack_5e8,_stdout);
        pcStack_720 = (code *)0x137d0d;
        fputc(10,_stdout);
        if (-1 < (int)uStack_70c) {
          pcStack_720 = (code *)0x137d21;
          iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_6e8,(ulong)uVar18);
        }
        pacVar11 = (char (*) [16])(&bStack_6e8 + (long)iVar4 * 0x10);
        pcStack_720 = (code *)0x137d3d;
        iVar3 = test_encode_int_all_sizes(pacVar11,uVar16);
        uVar18 = iVar4 + iVar3;
        if (uVar18 == 0 || SCARRY4(iVar4,iVar3) != (int)uVar18 < 0) {
          return;
        }
        fStack_6fc = (float)(int)uStack_70c;
        dStack_6f0 = (double)(int)uStack_70c;
        uStack_6f8 = (ulong)uVar18;
        puVar23 = (undefined1 *)((long)&uStack_6e7 + 1);
        lVar38 = 0;
        uStack_708 = uVar16;
        goto LAB_00137d70;
      }
      pacVar8 = (char (*) [16])(long)iVar3;
      pcVar15 = "(int64_t)num1 == (int64_t)num2";
      iVar3 = 0x746;
    }
    else {
      if (iVar3 < 0) {
LAB_00137baf:
        pcStack_4b8 = (code *)0x137bb4;
        test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_00137bb4:
        pcStack_4b8 = (code *)0x137bd3;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pacVar8 = (char (*) [16])(uVar16 & 0xffffffff);
      pcVar15 = "(uint64_t)num1 == (uint64_t)num2";
      iVar3 = 0x743;
    }
    pacVar11 = (char (*) [16])(ulong)(pacVar8 == pacStack_4b0);
    pcStack_4b8 = (code *)0x137b62;
    _ok((uint)(pacVar8 == pacStack_4b0),pcVar15,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar3,"check int number");
    pbVar31 = pbVar35;
    uVar34 = uStack_4a0;
  }
  uVar34 = uVar34 + 1;
  pbVar24 = pbVar24 + 0x10;
  pbVar35 = pbVar35 + -1;
  pbVar9 = pbVar31;
  puVar28 = (uint *)
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  if (pbVar35 == (byte *)0x0) {
    return;
  }
  goto LAB_00137808;
LAB_00137d70:
  lVar6 = lVar38 * 0x10;
  puVar12 = puVar23 + -2;
  bVar10 = puVar23[-2];
  uVar34 = (ulong)bVar10;
  uVar16 = (ulong)(char)bVar10;
  mVar1 = mp_type_hint[uVar34];
  puVar7 = puVar23;
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) goto LAB_0013809f;
      uVar18 = *(uint *)(puVar23 + -1);
      fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
      if ((fVar14 != fStack_6fc) || (NAN(fVar14) || NAN(fStack_6fc))) {
        pcStack_720 = (code *)0x1380c3;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380c3;
      }
      puVar7 = puVar23 + 3;
      goto LAB_00137e70;
    }
    if (mVar1 == MP_INT) {
      iVar3 = bVar10 - 0xd0;
      puVar28 = &switchD_00137dd0::switchdataD_00140d7c;
      switch(iVar3) {
      case 0:
        uVar34 = (ulong)(char)puVar23[-1];
        break;
      case 1:
        uVar34 = (ulong)(short)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8);
        puVar7 = auStack_6df + lVar6 + -6;
        break;
      case 2:
        uVar18 = *(uint *)(puVar23 + -1);
        uVar34 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                             uVar18 << 0x18);
        puVar7 = auStack_6df + lVar6 + -4;
        break;
      case 3:
        uVar34 = *(ulong *)(puVar23 + -1);
        uVar34 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                 (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                 (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                 (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38;
        puVar7 = auStack_6df + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_720 = (code *)0x13808b;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013808b;
        }
        uVar34 = uVar16;
        puVar28 = (uint *)pacVar11;
        puVar7 = auStack_6df + lVar6 + -8;
      }
      if (uVar34 != uStack_708) {
        pcStack_720 = (code *)0x1380e7;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_001380e7;
      }
      goto LAB_00137f04;
    }
    if (bVar10 != 0xcb) {
LAB_001380c3:
      pcStack_720 = (code *)0x1380e2;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar34 = *(ulong *)(puVar23 + -1);
    dVar17 = (double)(uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                      (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                      (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                      (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38);
    if ((dVar17 == dStack_6f0) && (!NAN(dVar17) && !NAN(dStack_6f0))) {
      puVar7 = auStack_6df + lVar6;
      goto LAB_00137e70;
    }
    goto LAB_0013809a;
  }
  iVar3 = bVar10 - 0xcc;
  puVar28 = &switchD_00137e2e::switchdataD_00140d6c;
  switch(iVar3) {
  case 0:
    uVar34 = (ulong)(byte)puVar23[-1];
    break;
  case 1:
    uVar34 = (ulong)(ushort)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8);
    puVar7 = auStack_6df + lVar6 + -6;
    break;
  case 2:
    uVar18 = *(uint *)(puVar23 + -1);
    uVar34 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    puVar7 = auStack_6df + lVar6 + -4;
    break;
  case 3:
    uVar34 = *(ulong *)(puVar23 + -1);
    uVar34 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
             (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
             (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28 |
             uVar34 << 0x38;
    puVar7 = auStack_6df + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      puVar28 = (uint *)pacVar11;
      puVar7 = auStack_6df + lVar6 + -8;
      break;
    }
LAB_0013808b:
    pcStack_720 = (code *)0x138090;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00138090;
  }
  if (uVar34 != uStack_708) {
LAB_001380e7:
    pcStack_720 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_850,"typed read of ",0xf);
    pcStack_988 = (code *)0x138151;
    pacStack_970 = (char (*) [16])puVar28;
    iStack_964 = iVar3;
    uStack_748 = uVar16;
    pcStack_740 = pcVar15;
    lStack_738 = lVar38;
    puStack_730 = puVar7;
    puStack_728 = puVar23;
    pcStack_720 = (code *)puVar12;
    iVar3 = snprintf(acStack_850 + 0xe,0xf2,"%llu",puVar28);
    pcVar15 = acStack_850 + (long)iVar3 + 0xe;
    pcStack_988 = (code *)0x138175;
    iVar3 = snprintf(pcVar15,(size_t)(auStack_750 + -(long)pcVar15)," into ");
    pcStack_988 = (code *)0x138194;
    snprintf(pcVar15 + iVar3,(size_t)(auStack_750 + -(long)(pcVar15 + iVar3)),"int%zu_t",0x40);
    pcStack_988 = (code *)0x1381a3;
    _space((FILE *)_stdout);
    pcStack_988 = (code *)0x1381bc;
    fwrite("# ",2,1,_stdout);
    pcStack_988 = (code *)0x1381cc;
    fputs(acStack_850,_stdout);
    pcStack_988 = (code *)0x1381d9;
    fputc(10,_stdout);
    pacVar11 = (char (*) [16])&bStack_950;
    pcStack_988 = (code *)0x1381e6;
    pcVar26 = (char *)puVar28;
    uVar18 = test_encode_uint_all_sizes(pacVar11,(uint64_t)puVar28);
    if (-1 < (long)puVar28) {
      pacVar11 = (char (*) [16])(&bStack_950 + (long)(int)uVar18 * 0x10);
      pcVar26 = (char *)0x7fffffffffffffff;
      pcStack_988 = (code *)0x13820b;
      iVar3 = test_encode_int_all_sizes(pacVar11,0x7fffffffffffffff);
      uVar18 = uVar18 + iVar3;
    }
    if ((int)uVar18 < 1) {
      return;
    }
    fStack_974 = (float)pacStack_970;
    auVar42._8_4_ = (int)((ulong)pacStack_970 >> 0x20);
    auVar42._0_8_ = pacStack_970;
    auVar42._12_4_ = 0x45300000;
    dStack_958 = auVar42._8_8_ - 1.9342813113834067e+25;
    dStack_960 = dStack_958 + ((double)CONCAT44(0x43300000,(int)pacStack_970) - 4503599627370496.0);
    pcVar21 = (char *)(ulong)uVar18;
    pcVar36 = (char *)((long)&uStack_94f + 1);
    lVar38 = 0;
    goto LAB_00138274;
  }
LAB_00137f04:
  switch(bVar10) {
  case 0xcc:
    uVar16 = (ulong)(byte)puVar23[-1];
    goto LAB_00137f32;
  case 0xcd:
    puVar12 = auStack_6df + lVar6 + -6;
    uVar16 = (ulong)(ushort)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8);
    break;
  case 0xce:
    uVar18 = *(uint *)(puVar23 + -1);
    uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    puVar12 = auStack_6df + lVar6 + -4;
    break;
  case 0xcf:
    uVar34 = *(ulong *)(puVar23 + -1);
    uVar16 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
             (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
             (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28 |
             uVar34 << 0x38;
    if (-1 < (long)uVar16) goto LAB_00137f5c;
LAB_00137e70:
    uVar16 = 0;
    iVar3 = 0;
    goto LAB_00137faa;
  case 0xd0:
    uVar16 = (ulong)(char)puVar23[-1];
LAB_00137f32:
    puVar12 = auStack_6df + lVar6 + -7;
    break;
  case 0xd1:
    puVar12 = auStack_6df + lVar6 + -6;
    uVar16 = (ulong)(short)(*(ushort *)(puVar23 + -1) << 8 | *(ushort *)(puVar23 + -1) >> 8);
    break;
  case 0xd2:
    uVar18 = *(uint *)(puVar23 + -1);
    puVar12 = auStack_6df + lVar6 + -4;
    uVar16 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                         uVar18 << 0x18);
    break;
  case 0xd3:
    uVar34 = *(ulong *)(puVar23 + -1);
    uVar16 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
             (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
             (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28 |
             uVar34 << 0x38;
LAB_00137f5c:
    puVar12 = auStack_6df + lVar6;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_00137e70;
    puVar12 = auStack_6df + lVar6 + -8;
  }
  iVar3 = 1;
LAB_00137faa:
  pcVar15 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_720 = (code *)0x137fd2;
  _ok(iVar3,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
  pcStack_720 = (code *)0x137ff8;
  _ok((uint)(puVar7 == puVar12),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  if ((int)uStack_70c < 0) {
    if (-1 < (long)uVar16) goto LAB_00138095;
    pcVar26 = "(int64_t)num1 == (int64_t)num2";
    iVar3 = 0x746;
  }
  else {
    if ((long)uVar16 < 0) {
LAB_00138090:
      pcStack_720 = (code *)0x138095;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00138095:
      pcStack_720 = (code *)0x13809a;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809a:
      pcStack_720 = (code *)0x13809f;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013809f:
      pcStack_720 = (code *)0x1380be;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar26 = "(uint64_t)num1 == (uint64_t)num2";
    iVar3 = 0x743;
  }
  pacVar11 = (char (*) [16])(ulong)(uVar16 == uStack_708);
  pcStack_720 = (code *)0x13805f;
  _ok((uint)(uVar16 == uStack_708),pcVar26,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      "check int number");
  lVar38 = lVar38 + 1;
  puVar23 = puVar23 + 0x10;
  uStack_6f8 = uStack_6f8 - 1;
  if (uStack_6f8 == 0) {
    return;
  }
  goto LAB_00137d70;
LAB_00138274:
  lVar6 = lVar38 * 0x10;
  pcVar32 = pcVar36 + -2;
  bVar10 = pcVar36[-2];
  pacVar8 = (char (*) [16])(ulong)bVar10;
  pacVar29 = (char (*) [16])(long)(char)bVar10;
  mVar1 = mp_type_hint[(long)pacVar8];
  if (mVar1 != MP_UINT) {
    if (mVar1 == MP_FLOAT) {
      if (bVar10 != 0xca) {
LAB_001385f4:
        pcStack_988 = (code *)0x138613;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar18 = *(uint *)(pcVar36 + -1);
      fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
      if ((fVar14 == fStack_974) && (!NAN(fVar14) && !NAN(fStack_974))) {
        pcVar15 = pcVar36 + 3;
        goto LAB_0013837a;
      }
      pcStack_988 = (code *)0x138618;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00138618:
      pcStack_988 = (code *)0x13861d;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_0013861d;
    }
    if (mVar1 == MP_INT) {
      switch(bVar10) {
      case 0xd0:
        pacVar8 = (char (*) [16])(long)pcVar36[-1];
        pcVar26 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = pcVar36;
        break;
      case 0xd1:
        pacVar8 = (char (*) [16])
                  (long)(short)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8);
        pcVar26 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = acStack_947 + lVar6 + -6;
        break;
      case 0xd2:
        uVar18 = *(uint *)(pcVar36 + -1);
        pacVar8 = (char (*) [16])
                  (long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                             uVar18 << 0x18);
        pcVar26 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = acStack_947 + lVar6 + -4;
        break;
      case 0xd3:
        uVar34 = *(ulong *)(pcVar36 + -1);
        pacVar8 = (char (*) [16])
                  (uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                   (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                   (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                   (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38);
        pcVar26 = (char *)&switchD_001382d0::switchdataD_00140dbc;
        pcVar15 = acStack_947 + lVar6;
        break;
      default:
        if (bVar10 < 0xe0) {
          pcStack_988 = (code *)0x1385c6;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_001385c6;
        }
        pacVar8 = pacVar29;
        pcVar15 = acStack_947 + lVar6 + -8;
      }
      if (pacVar8 != pacStack_970) goto LAB_00138618;
      goto LAB_0013840f;
    }
    if (bVar10 != 0xcb) goto LAB_001385d0;
    uVar34 = *(ulong *)(pcVar36 + -1);
    dVar17 = (double)(uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                      (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                      (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                      (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38);
    if ((dVar17 != dStack_960) || (NAN(dVar17) || NAN(dStack_960))) {
      pcStack_988 = (code *)0x1385f4;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_001385f4;
    }
    pcVar15 = acStack_947 + lVar6;
    goto LAB_0013837a;
  }
  switch(bVar10) {
  case 0xcc:
    pacVar8 = (char (*) [16])(ulong)(byte)pcVar36[-1];
    pcVar26 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = pcVar36;
    break;
  case 0xcd:
    pacVar8 = (char (*) [16])
              (ulong)(ushort)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8);
    pcVar26 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = acStack_947 + lVar6 + -6;
    break;
  case 0xce:
    uVar18 = *(uint *)(pcVar36 + -1);
    pacVar8 = (char (*) [16])
              (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                     uVar18 << 0x18);
    pcVar26 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = acStack_947 + lVar6 + -4;
    break;
  case 0xcf:
    uVar34 = *(ulong *)(pcVar36 + -1);
    pacVar8 = (char (*) [16])
              (uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
               (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
               (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28
              | uVar34 << 0x38);
    pcVar26 = (char *)&switchD_00138333::switchdataD_00140dac;
    pcVar15 = acStack_947 + lVar6;
    break;
  default:
    if (-1 < (char)bVar10) {
      pcVar15 = acStack_947 + lVar6 + -8;
      break;
    }
LAB_001385c6:
    pcStack_988 = (code *)0x1385cb;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    goto LAB_001385cb;
  }
  if (pacVar8 != pacStack_970) {
LAB_0013861d:
    pcStack_988 = test_read_num<double,int,int(*)(char_const**,double*)>;
    test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
    iVar3 = (int)pacVar11;
    builtin_strncpy(acStack_ab8,"typed read of ",0xf);
    pcStack_be8 = (code *)(long)iVar3;
    if (iVar3 < 0) {
      pcVar32 = "%lld";
      pcVar13 = pcStack_be8;
    }
    else {
      pcVar32 = "%llu";
      pcVar13 = (code *)((ulong)pacVar11 & 0xffffffff);
    }
    pcStack_bf0 = (code *)0x1386a4;
    pacStack_bc0 = (char (*) [16])pcVar26;
    pacStack_9b0 = (char (*) [16])pcVar21;
    pcStack_9a8 = pcVar15;
    pcStack_9a0 = pcVar36;
    pacStack_998 = (char (*) [16])puVar28;
    lStack_990 = lVar38;
    pcStack_988 = (code *)(&bStack_950 + lVar6);
    iVar4 = snprintf(acStack_ab8 + 0xe,0xf2,pcVar32,pcVar13);
    pcVar15 = acStack_ab8 + 0xe + iVar4;
    iVar5 = 0;
    pcStack_bf0 = (code *)0x1386c3;
    iVar4 = snprintf(pcVar15,(size_t)(auStack_9b8 + -(long)pcVar15)," into ");
    puVar23 = auStack_9b8 + -(long)(pcVar15 + iVar4);
    pcStack_bf0 = (code *)0x1386dd;
    snprintf(pcVar15 + iVar4,(size_t)puVar23,"double");
    pcStack_bf0 = (code *)0x1386ec;
    _space((FILE *)_stdout);
    pcStack_bf0 = (code *)0x138705;
    fwrite("# ",2,1,_stdout);
    pcStack_bf0 = (code *)0x138715;
    fputs(acStack_ab8,_stdout);
    pcStack_bf0 = (code *)0x138722;
    fputc(10,_stdout);
    if (-1 < iVar3) {
      pcStack_bf0 = (code *)0x138733;
      iVar5 = test_encode_uint_all_sizes
                        ((char (*) [16])&bStack_bb8,(uint64_t)((ulong)pacVar11 & 0xffffffff));
    }
    pcVar26 = (char *)(&bStack_bb8 + (long)iVar5 * 0x10);
    pcStack_bf0 = (code *)0x138751;
    pcVar15 = (char *)pcStack_be8;
    iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar26,(int64_t)pcStack_be8);
    uVar18 = iVar5 + iVar4;
    if (uVar18 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar18 < 0) {
      return;
    }
    fStack_bdc = (float)iVar3;
    dStack_bd8 = (double)iVar3;
    uVar34 = (ulong)uVar18;
    puVar37 = (undefined8 *)(auStack_bb7 + 1);
    pcVar36 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar38 = 0;
    goto LAB_00138782;
  }
LAB_0013840f:
  switch(bVar10) {
  case 0xcc:
    pacVar29 = (char (*) [16])(ulong)(byte)pcVar36[-1];
    goto LAB_0013843d;
  case 0xcd:
    pcVar25 = acStack_947 + lVar6 + -6;
    pacVar29 = (char (*) [16])
               (ulong)(ushort)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8);
    break;
  case 0xce:
    uVar18 = *(uint *)(pcVar36 + -1);
    pacVar29 = (char (*) [16])
               (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
    pcVar25 = acStack_947 + lVar6 + -4;
    break;
  case 0xcf:
    uVar34 = *(ulong *)(pcVar36 + -1);
    pacVar29 = (char (*) [16])
               (uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28
               | uVar34 << 0x38);
    if (-1 < (long)pacVar29) goto LAB_00138468;
LAB_0013837a:
    pacVar29 = (char (*) [16])0x0;
    iVar4 = 1;
    iVar3 = 0;
    pcVar25 = pcVar32;
    goto LAB_001384b7;
  case 0xd0:
    pacVar29 = (char (*) [16])(long)pcVar36[-1];
LAB_0013843d:
    pcVar25 = acStack_947 + lVar6 + -7;
    break;
  case 0xd1:
    pcVar25 = acStack_947 + lVar6 + -6;
    pacVar29 = (char (*) [16])
               (long)(short)(*(ushort *)(pcVar36 + -1) << 8 | *(ushort *)(pcVar36 + -1) >> 8);
    break;
  case 0xd2:
    uVar18 = *(uint *)(pcVar36 + -1);
    pcVar25 = acStack_947 + lVar6 + -4;
    pacVar29 = (char (*) [16])
               (long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                          uVar18 << 0x18);
    break;
  case 0xd3:
    uVar34 = *(ulong *)(pcVar36 + -1);
    pacVar29 = (char (*) [16])
               (uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28
               | uVar34 << 0x38);
LAB_00138468:
    pcVar25 = acStack_947 + lVar6;
    break;
  default:
    if ((char)bVar10 < -0x20) goto LAB_0013837a;
    pcVar25 = acStack_947 + lVar6 + -8;
  }
  iVar3 = 1;
  iVar4 = 0;
LAB_001384b7:
  if ((char)iStack_964 == '\0') {
    pcVar39 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_988 = (code *)0x138579;
    _ok(iVar4,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pacVar11 = (char (*) [16])(ulong)(pcVar32 == pcVar25);
    pcVar26 = "mp_num_pos2 == mp_nums[i]";
    pcStack_988 = (code *)0x13859f;
    _ok((uint)(pcVar32 == pcVar25),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcStack_988 = (code *)0x1384ef;
    _ok(iVar3,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar10);
    pcVar32 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_988 = (code *)0x13851c;
    _ok((uint)(pcVar15 == pcVar25),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if ((long)pacVar29 < 0) {
LAB_001385cb:
      pcStack_988 = (code *)0x1385d0;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_001385d0:
      pcStack_988 = (code *)0x1385ef;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pacVar11 = (char (*) [16])(ulong)(pacVar29 == pacStack_970);
    pcVar26 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_988 = (code *)0x13854d;
    _ok((uint)(pacVar29 == pacStack_970),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar39 = pcVar21;
  }
  lVar38 = lVar38 + 1;
  pcVar36 = pcVar36 + 0x10;
  pcVar21 = pcVar21 + -1;
  pcVar15 = pcVar32;
  puVar28 = (uint *)pcVar39;
  if (pcVar21 == (char *)0x0) {
    return;
  }
  goto LAB_00138274;
LAB_00138782:
  lVar6 = lVar38 * 0x10;
  bVar10 = *(byte *)((long)puVar37 + -2);
  pcVar13 = (code *)(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pcVar13];
  puVar22 = puVar37;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pcVar13 = (code *)(ulong)*(byte *)((long)puVar37 + -1);
      break;
    case 0xcd:
      pcVar13 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar37 + -1) << 8 |
                                       *(ushort *)((long)puVar37 + -1) >> 8);
      puVar22 = (undefined8 *)((long)auStack_baf + lVar6 + -6);
      break;
    case 0xce:
      uVar18 = *(uint *)((long)puVar37 + -1);
      pcVar13 = (code *)(ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                               uVar18 << 0x18);
      puVar22 = (undefined8 *)((long)auStack_baf + lVar6 + -4);
      break;
    case 0xcf:
      uVar16 = *(ulong *)((long)puVar37 + -1);
      pcVar13 = (code *)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      puVar22 = auStack_baf + lVar38 * 2;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_001389dc:
        pcStack_bf0 = (code *)0x1389e1;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e1:
        pcStack_bf0 = (code *)0x1389e6;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001389e6:
        pcStack_bf0 = (code *)0x138a05;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar22 = auStack_baf + lVar38 * 2 + -1;
    }
    if (pcVar13 != pcStack_be8) {
      pcStack_bf0 = (code *)0x138a2e;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_00138a2e:
      pcStack_bf0 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_bf0 = (code *)0x1411a4;
      builtin_strncpy(acStack_d20,"typed read of ",0xf);
      pcStack_e58 = (code *)0x138a9a;
      uStack_e3c = extraout_EDX;
      pcStack_e28 = (code *)pcVar15;
      puStack_c18 = puVar22;
      uStack_c10 = uVar34;
      puStack_c08 = puVar37;
      lStack_c00 = lVar38;
      puStack_bf8 = puVar23;
      iVar3 = snprintf(acStack_d20 + 0xe,0xf2,"%llu",pcVar26);
      pcVar15 = acStack_d20 + (long)iVar3 + 0xe;
      pcStack_e58 = (code *)0x138abe;
      iVar3 = snprintf(pcVar15,(size_t)(auStack_c20 + -(long)pcVar15)," into ");
      pcStack_e58 = (code *)0x138ad8;
      snprintf(pcVar15 + iVar3,(size_t)(auStack_c20 + -(long)(pcVar15 + iVar3)),"double");
      pcStack_e58 = (code *)0x138ae7;
      _space((FILE *)_stdout);
      pcStack_e58 = (code *)0x138b00;
      fwrite("# ",2,1,_stdout);
      pcStack_e58 = (code *)0x138b10;
      fputs(acStack_d20,_stdout);
      pcStack_e58 = (code *)0x138b1d;
      fputc(10,_stdout);
      pcStack_e58 = (code *)0x138b2a;
      iVar3 = test_encode_uint_all_sizes((char (*) [16])&bStack_e20,(uint64_t)pcVar26);
      pacVar11 = (char (*) [16])(&bStack_e20 + (long)iVar3 * 0x10);
      pcStack_e58 = (code *)0x138b48;
      pacStack_e50 = (char (*) [16])pcVar26;
      iVar4 = test_encode_int_all_sizes(pacVar11,(int64_t)pcVar26);
      uVar18 = iVar3 + iVar4;
      if (uVar18 == 0 || SCARRY4(iVar3,iVar4) != (int)uVar18 < 0) {
        return;
      }
      fStack_e40 = (float)(long)pacStack_e50;
      dStack_e38 = (double)(long)pacStack_e50;
      uVar34 = (ulong)uVar18;
      pcVar21 = (char *)((long)&uStack_e1f + 1);
      lVar38 = 0;
      goto LAB_00138b77;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138a0a:
      pcStack_bf0 = (code *)0x138a29;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)((long)puVar37 + -1);
    fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar14 != fStack_bdc) || (NAN(fVar14) || NAN(fStack_bdc))) goto LAB_001389e1;
    puVar22 = (undefined8 *)((long)puVar37 + 3);
  }
  else if (mVar1 == MP_INT) {
    pcVar13 = (code *)(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pcVar13 = (code *)(long)*(char *)((long)puVar37 + -1);
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd1:
      pcVar13 = (code *)(long)(short)(*(ushort *)((long)puVar37 + -1) << 8 |
                                     *(ushort *)((long)puVar37 + -1) >> 8);
      puVar22 = (undefined8 *)((long)auStack_baf + lVar6 + -6);
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd2:
      uVar18 = *(uint *)((long)puVar37 + -1);
      pcVar13 = (code *)(long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                    (uVar18 & 0xff00) << 8 | uVar18 << 0x18);
      puVar22 = (undefined8 *)((long)auStack_baf + lVar6 + -4);
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    case 0xd3:
      uVar16 = *(ulong *)((long)puVar37 + -1);
      pcVar13 = (code *)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                         (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                         (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                         (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      puVar22 = auStack_baf + lVar38 * 2;
      pcVar15 = (char *)&switchD_001387d7::switchdataD_00140dfc;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_bf0 = (code *)0x1389dc;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001389dc;
      }
      puVar22 = auStack_baf + lVar38 * 2 + -1;
    }
    if (pcVar13 != pcStack_be8) goto LAB_00138a2e;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_001389e6;
    uVar16 = *(ulong *)((long)puVar37 + -1);
    dVar17 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar17 != dStack_bd8) || (NAN(dVar17) || NAN(dStack_bd8))) {
      pcStack_bf0 = (code *)0x138a0a;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_00138a0a;
    }
    puVar22 = auStack_baf + lVar38 * 2;
  }
  puStack_bc8 = (undefined8 *)((long)puVar37 + -2);
  puVar23 = (undefined1 *)(ulong)(uint)(int)(char)bVar10;
  dStack_bd0 = 0.0;
  pcStack_bf0 = (code *)0x138922;
  iVar3 = (*(code *)pacStack_bc0)(&puStack_bc8,&dStack_bd0);
  pcStack_bf0 = (code *)0x13894a;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar23);
  pcStack_bf0 = (code *)0x138972;
  _ok((uint)(puVar22 == puStack_bc8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar41 = ABS(dStack_bd8 - dStack_bd0) < 1e-15;
  pcVar26 = (char *)(ulong)bVar41;
  pcVar15 = "double_eq(num1, num2)";
  pcStack_bf0 = (code *)0x1389b5;
  _ok((uint)bVar41,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar38 = lVar38 + 1;
  puVar37 = puVar37 + 2;
  uVar34 = uVar34 - 1;
  if (uVar34 == 0) {
    return;
  }
  goto LAB_00138782;
LAB_00138b77:
  lVar6 = lVar38 * 0x10;
  bVar10 = pcVar21[-2];
  pacVar8 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar8];
  pcVar32 = pcVar21;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar8 = (char (*) [16])(ulong)(byte)pcVar21[-1];
      break;
    case 0xcd:
      pacVar8 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar21 + -1) << 8 | *(ushort *)(pcVar21 + -1) >> 8);
      pcVar32 = acStack_e17 + lVar6 + -6;
      break;
    case 0xce:
      uVar18 = *(uint *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                       uVar18 << 0x18);
      pcVar32 = acStack_e17 + lVar6 + -4;
      break;
    case 0xcf:
      uVar16 = *(ulong *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar32 = acStack_e17 + lVar38 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00138e36:
        pcStack_e58 = (code *)0x138e3b;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
        pcStack_e58 = (code *)0x138e40;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
        pcStack_e58 = (code *)0x138e5f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar32 = acStack_e17 + (lVar38 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_e50) {
      pcStack_e58 = (code *)0x138e88;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
      pcStack_e58 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1088,"typed read of ",0xf);
      pcStack_10c0 = (code *)0x138ef1;
      uStack_10a4 = extraout_EDX_00;
      pacStack_1090 = (char (*) [16])pcVar26;
      lStack_e80 = lVar38;
      uStack_e78 = uVar34;
      pcStack_e70 = pcVar15;
      pcStack_e68 = pcVar32;
      pcStack_e60 = pcVar21;
      pcStack_e58 = (code *)pcVar36;
      iVar3 = snprintf(acStack_1088 + 0xe,0xf2,"%lld",pacVar11);
      pcVar15 = acStack_1088 + (long)iVar3 + 0xe;
      pcStack_10c0 = (code *)0x138f12;
      iVar3 = snprintf(pcVar15,(size_t)(&bStack_f88 + -(long)pcVar15)," into ");
      pcStack_10c0 = (code *)0x138f2c;
      snprintf(pcVar15 + iVar3,(size_t)(&bStack_f88 + -(long)(pcVar15 + iVar3)),"double");
      pcStack_10c0 = (code *)0x138f3b;
      _space((FILE *)_stdout);
      pcStack_10c0 = (code *)0x138f54;
      fwrite("# ",2,1,_stdout);
      pcStack_10c0 = (code *)0x138f61;
      fputs(acStack_1088,_stdout);
      pcStack_10c0 = (code *)0x138f6e;
      fputc(10,_stdout);
      pacVar8 = (char (*) [16])&bStack_f88;
      pcStack_10c0 = (code *)0x138f82;
      pacStack_10b8 = pacVar11;
      uVar18 = test_encode_int_all_sizes(pacVar8,(int64_t)pacVar11);
      if ((int)uVar18 < 1) {
        return;
      }
      fStack_10a8 = (float)(long)pacStack_10b8;
      dStack_10a0 = (double)(long)pacStack_10b8;
      uVar34 = (ulong)uVar18;
      pcVar26 = (char *)((long)&uStack_f87 + 1);
      lVar38 = 0;
      goto LAB_00138fb4;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_00138e64:
      pcStack_e58 = (code *)0x138e83;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)(pcVar21 + -1);
    fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar14 != fStack_e40) || (NAN(fVar14) || NAN(fStack_e40))) goto LAB_00138e3b;
    pcVar32 = pcVar21 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar8 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar8 = (char (*) [16])(long)pcVar21[-1];
      pcVar26 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      break;
    case 0xd1:
      pacVar8 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar21 + -1) << 8 | *(ushort *)(pcVar21 + -1) >> 8);
      pcVar26 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_e17 + lVar6 + -6;
      break;
    case 0xd2:
      uVar18 = *(uint *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                           uVar18 << 0x18);
      pcVar26 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_e17 + lVar6 + -4;
      break;
    case 0xd3:
      uVar16 = *(ulong *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar26 = (char *)&switchD_00138bcc::switchdataD_00140e1c;
      pcVar32 = acStack_e17 + lVar38 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_e58 = (code *)0x138e36;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00138e36;
      }
      pcVar32 = acStack_e17 + (lVar38 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_e50) goto LAB_00138e88;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00138e40;
    uVar16 = *(ulong *)(pcVar21 + -1);
    dVar17 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar17 != dStack_e38) || (NAN(dVar17) || NAN(dStack_e38))) {
      pcStack_e58 = (code *)0x138e64;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00138e64;
    }
    pcVar32 = acStack_e17 + lVar38 * 0x10;
  }
  pcVar36 = pcVar21 + -2;
  pcVar15 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_e30 = 0.0;
  pcStack_e58 = (code *)0x138d17;
  pcStack_e48 = pcVar36;
  iVar3 = (*pcStack_e28)(&pcStack_e48,&dStack_e30);
  if ((char)uStack_e3c == '\0') {
    pcStack_e58 = (code *)0x138de7;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar15);
    bVar41 = pcVar36 == pcStack_e48;
    pcVar26 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    pcVar32 = "check position";
  }
  else {
    pcVar36 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_e58 = (code *)0x138d51;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar15);
    pcStack_e58 = (code *)0x138d79;
    _ok((uint)(pcVar32 == pcStack_e48),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar41 = ABS(dStack_e38 - dStack_e30) < 1e-15;
    pcVar26 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    pcVar32 = "check float number";
  }
  pacVar11 = (char (*) [16])(ulong)bVar41;
  pcStack_e58 = (code *)0x138e0f;
  _ok((uint)bVar41,pcVar26,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      pcVar32);
  lVar38 = lVar38 + 1;
  pcVar21 = pcVar21 + 0x10;
  uVar34 = uVar34 - 1;
  if (uVar34 == 0) {
    return;
  }
  goto LAB_00138b77;
LAB_00138fb4:
  lVar6 = lVar38 * 0x10;
  bVar10 = pcVar26[-2];
  pacVar11 = (char (*) [16])(ulong)bVar10;
  mVar1 = mp_type_hint[(long)pacVar11];
  pcVar21 = pcVar26;
  if (mVar1 == MP_UINT) {
    switch(bVar10) {
    case 0xcc:
      pacVar11 = (char (*) [16])(ulong)(byte)pcVar26[-1];
      break;
    case 0xcd:
      pacVar11 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar26 + -1) << 8 | *(ushort *)(pcVar26 + -1) >> 8);
      pcVar21 = acStack_f7f + lVar6 + -6;
      break;
    case 0xce:
      uVar18 = *(uint *)(pcVar26 + -1);
      pacVar11 = (char (*) [16])
                 (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
      pcVar21 = acStack_f7f + lVar6 + -4;
      break;
    case 0xcf:
      uVar16 = *(ulong *)(pcVar26 + -1);
      pacVar11 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar21 = acStack_f7f + lVar38 * 0x10;
      break;
    default:
      if ((char)bVar10 < '\0') {
LAB_00139276:
        pcStack_10c0 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_10c0 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_10c0 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar21 = acStack_f7f + (lVar38 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_10b8) {
      pcStack_10c0 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_10c0 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_12f0,"typed read of ",0xf);
      uVar33 = CONCAT71((int7)(uVar34 >> 8),1);
      pcStack_1308 = (code *)0x13932e;
      lStack_10e8 = lVar38;
      uStack_10e0 = uVar34;
      pcStack_10d8 = pcVar15;
      pcStack_10d0 = pcVar21;
      pcStack_10c8 = pcVar26;
      pcStack_10c0 = (code *)pcVar36;
      iVar3 = snprintf(acStack_12f0 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar15 = acStack_12f0 + (long)iVar3 + 0xe;
      pcStack_1308 = (code *)0x13934f;
      iVar3 = snprintf(pcVar15,(size_t)(abStack_11f0 + -(long)pcVar15)," into ");
      pcStack_1308 = (code *)0x139369;
      snprintf(pcVar15 + iVar3,(size_t)(abStack_11f0 + -(long)(pcVar15 + iVar3)),"double");
      puVar40 = &stdout;
      pcStack_1308 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_1308 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_1308 = (code *)0x13939e;
      fputs(acStack_12f0,_stdout);
      pcVar13 = (code *)0xa;
      pcStack_1308 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_11f0[0] = 0xca;
      abStack_11f0[1] = 0x4a;
      abStack_11f0[2] = 200;
      abStack_11f0[3] = 0x59;
      abStack_11f0[4] = 0x10;
      abStack_11e0[0] = 0xcb;
      abStack_11e0[1] = 0x41;
      abStack_11e0[2] = 0x59;
      abStack_11e0[3] = 0xb;
      abStack_11e0[4] = 0x22;
      abStack_11e0[5] = 0;
      abStack_11e0[6] = 0;
      abStack_11e0[7] = 0;
      abStack_11e0[8] = 0;
      pbVar9 = abStack_11f0;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001392a4:
      pcStack_10c0 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)(pcVar26 + -1);
    fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar14 != fStack_10a8) || (NAN(fVar14) || NAN(fStack_10a8))) goto LAB_0013927b;
    pcVar21 = pcVar26 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar11 = (char (*) [16])(long)(char)bVar10;
    switch(bVar10) {
    case 0xd0:
      pacVar11 = (char (*) [16])(long)pcVar26[-1];
      break;
    case 0xd1:
      pacVar11 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar26 + -1) << 8 | *(ushort *)(pcVar26 + -1) >> 8);
      pcVar21 = acStack_f7f + lVar6 + -6;
      break;
    case 0xd2:
      uVar18 = *(uint *)(pcVar26 + -1);
      pacVar11 = (char (*) [16])
                 (long)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                            uVar18 << 0x18);
      pcVar21 = acStack_f7f + lVar6 + -4;
      break;
    case 0xd3:
      uVar16 = *(ulong *)(pcVar26 + -1);
      pacVar11 = (char (*) [16])
                 (uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                  (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                  (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                  (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
      pcVar21 = acStack_f7f + lVar38 * 0x10;
      break;
    default:
      if (bVar10 < 0xe0) {
        pcStack_10c0 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar21 = acStack_f7f + (lVar38 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_10b8) goto LAB_001392c8;
  }
  else {
    if (bVar10 != 0xcb) goto LAB_00139280;
    uVar16 = *(ulong *)(pcVar26 + -1);
    dVar17 = (double)(uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                      (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                      (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                      (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38);
    if ((dVar17 != dStack_10a0) || (NAN(dVar17) || NAN(dStack_10a0))) {
      pcStack_10c0 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar21 = acStack_f7f + lVar38 * 0x10;
  }
  pcVar36 = pcVar26 + -2;
  pcVar15 = (char *)(ulong)(uint)(int)(char)bVar10;
  dStack_1098 = 0.0;
  pcStack_10c0 = (code *)0x139157;
  pcStack_10b0 = pcVar36;
  iVar3 = (*(code *)pacStack_1090)(&pcStack_10b0,&dStack_1098);
  if ((char)uStack_10a4 == '\0') {
    pcStack_10c0 = (code *)0x139227;
    _ok((uint)(iVar3 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar15);
    bVar41 = pcVar36 == pcStack_10b0;
    pcVar21 = "mp_num_pos2 == mp_nums[i]";
    iVar3 = 0x738;
    pcVar32 = "check position";
  }
  else {
    pcVar36 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_10c0 = (code *)0x139191;
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar15);
    pcStack_10c0 = (code *)0x1391b9;
    _ok((uint)(pcVar21 == pcStack_10b0),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar41 = ABS(dStack_10a0 - dStack_1098) < 1e-15;
    pcVar21 = "double_eq(num1, num2)";
    iVar3 = 0x73e;
    pcVar32 = "check float number";
  }
  pacVar8 = (char (*) [16])(ulong)bVar41;
  pcStack_10c0 = (code *)0x13924f;
  _ok((uint)bVar41,pcVar21,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar3,
      pcVar32);
  lVar38 = lVar38 + 1;
  pcVar26 = pcVar26 + 0x10;
  uVar34 = uVar34 - 1;
  if (uVar34 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar10 = *pbVar9;
  uVar34 = (ulong)bVar10;
  mVar1 = mp_type_hint[uVar34];
  if (mVar1 == MP_UINT) {
    if (bVar10 == 0xce) {
      uVar18 = *(uint *)(pbVar9 + 1);
      uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18);
      pbVar24 = pbVar9 + 5;
LAB_001394a6:
      if (uVar16 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar10 == 0xcf) {
        uVar16 = *(ulong *)(pbVar9 + 1);
        uVar16 = uVar16 >> 0x38 | (uVar16 & 0xff000000000000) >> 0x28 |
                 (uVar16 & 0xff0000000000) >> 0x18 | (uVar16 & 0xff00000000) >> 8 |
                 (uVar16 & 0xff000000) << 8 | (uVar16 & 0xff0000) << 0x18 |
                 (uVar16 & 0xff00) << 0x28 | uVar16 << 0x38;
        pbVar24 = pbVar9 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar10 - 0xcc) && ((char)bVar10 < '\0')) {
        pcStack_1308 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_1308 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar10 = (byte)uVar34;
    uVar18 = extraout_EDX_01;
LAB_001395b5:
    if ((1 < uVar18 - 0xd0) && (bVar10 < 0xe0)) {
LAB_00139617:
      pcStack_1308 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1528,"typed read of ",0xf);
      pacStack_1320 = pacVar8;
      uStack_1318 = uVar33;
      puStack_1310 = puVar40;
      pcStack_1308 = (code *)abStack_11e0;
      iVar3 = snprintf(acStack_1528 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar15 = acStack_1528 + (long)iVar3 + 0xe;
      iVar3 = snprintf(pcVar15,(size_t)(&uStack_1428 + -(long)pcVar15)," into ");
      snprintf(pcVar15 + iVar3,(size_t)(&uStack_1428 + -(long)(pcVar15 + iVar3)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_1528,_stdout);
      fputc(10,_stdout);
      puStack_1530 = &uStack_1428;
      uStack_1428 = 0xcb;
      uStack_1427 = 0xb81e85eb513816c0;
      dStack_1538 = 0.0;
      iVar3 = (*pcVar13)(&puStack_1530,&dStack_1538);
      _ok((uint)(iVar3 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_141f == puStack_1530),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_1538) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_1308 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_1308 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_1308 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar10 != 0xca) {
LAB_001395f3:
      pcStack_1308 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar18 = *(uint *)(pbVar9 + 1);
    fVar14 = (float)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18);
    if ((fVar14 == 6.565e+06) && (!NAN(fVar14))) {
      pbVar24 = pbVar9 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar10 != 0xd2) {
      uVar18 = (uint)bVar10;
      if (bVar10 == 0xd3) {
        uVar34 = *(ulong *)(pbVar9 + 1);
        uVar34 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                 (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                 (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                 (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38;
        pbVar24 = pbVar9 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar18 = *(uint *)(pbVar9 + 1);
    pbVar24 = pbVar9 + 5;
    uVar34 = (ulong)(int)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                         uVar18 << 0x18);
LAB_001394c0:
    if (uVar34 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar10 != 0xcb) goto LAB_001395cf;
  uVar34 = *(ulong *)(pbVar9 + 1);
  dVar17 = (double)(uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
                    (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
                    (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 |
                    (uVar34 & 0xff00) << 0x28 | uVar34 << 0x38);
  if ((dVar17 != 6565000.0) || (NAN(dVar17))) {
    pcStack_1308 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar24 = pbVar9 + 9;
LAB_001394cd:
  puVar40 = (undefined *)(ulong)(uint)(int)(char)bVar10;
  dStack_1300 = 0.0;
  pcStack_1308 = (code *)0x1394e8;
  pbStack_12f8 = pbVar9;
  iVar3 = (*(code *)pacVar8)(&pbStack_12f8,&dStack_1300);
  pcStack_1308 = (code *)0x139510;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar40);
  pcStack_1308 = (code *)0x139538;
  _ok((uint)(pbVar24 == pbStack_12f8),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar41 = ABS(6565000.0 - dStack_1300) < 1e-15;
  pcVar13 = (code *)(ulong)bVar41;
  pcStack_1308 = (code *)0x13957c;
  _ok((uint)bVar41,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar30 = (char)uVar33;
  uVar33 = 0;
  pbVar9 = abStack_11e0;
  if (cVar30 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}